

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::BaseTestInstance::uploadVertexAttributes
          (BaseTestInstance *this,vector<float,_std::allocator<float>_> *vertexData)

{
  DeviceInterface *vkd;
  VkDevice device_00;
  Allocation *this_00;
  void *dst;
  const_reference src;
  size_t sVar1;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  Allocation *alloc;
  VkDevice device;
  DeviceInterface *vk;
  vector<float,_std::allocator<float>_> *vertexData_local;
  BaseTestInstance *this_local;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  this_00 = tessellation::Buffer::getAllocation(&this->m_vertexBuffer);
  dst = ::vk::Allocation::getHostPtr(this_00);
  src = std::vector<float,_std::allocator<float>_>::operator[](vertexData,0);
  sVar1 = sizeInBytes<float>(vertexData);
  ::deMemcpy(dst,src,sVar1);
  memory = ::vk::Allocation::getMemory(this_00);
  offset = ::vk::Allocation::getOffset(this_00);
  sVar1 = sizeInBytes<float>(vertexData);
  ::vk::flushMappedMemoryRange(vkd,device_00,memory,offset,sVar1);
  return;
}

Assistant:

void BaseTestInstance::uploadVertexAttributes (const std::vector<float>& vertexData)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const Allocation& alloc = m_vertexBuffer.getAllocation();
	deMemcpy(alloc.getHostPtr(), &vertexData[0], sizeInBytes(vertexData));
	flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeInBytes(vertexData));
}